

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

int Abc_NodeCompareNames(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  int Diff;
  Abc_Obj_t **pp2_local;
  Abc_Obj_t **pp1_local;
  
  iVar1 = strcmp((char *)((*pp1)->field_6).pTemp,(char *)((*pp2)->field_6).pTemp);
  if (iVar1 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 < 1) {
    iVar1 = (*pp1)->Id - (*pp2)->Id;
    if (iVar1 < 0) {
      pp1_local._4_4_ = -1;
    }
    else if (iVar1 < 1) {
      pp1_local._4_4_ = 0;
    }
    else {
      pp1_local._4_4_ = 1;
    }
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Abc_NodeCompareNames( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = strcmp( (char *)(*pp1)->pCopy, (char *)(*pp2)->pCopy );
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = (*pp1)->Id - (*pp2)->Id;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}